

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  DisassemblerMode DVar1;
  VectorExtensionType VVar2;
  uint64_t uVar3;
  short sVar4;
  bool bVar5;
  uint8_t uVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint64_t uVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar13;
  ulong uVar14;
  uint8_t uVar15;
  ushort uVar16;
  short sVar18;
  uint64_t uVar19;
  byte bVar20;
  uint8_t uVar21;
  uint8_t *puVar22;
  reader_info *prVar23;
  uint8_t *puVar24;
  ulong uVar25;
  bool bVar26;
  uint8_t byte;
  uint8_t byte1;
  uint8_t nextByte;
  uint8_t byte2;
  ushort local_50;
  byte local_4d;
  ushort local_4c;
  byte local_49;
  ulong local_48;
  _Bool *local_40;
  undefined8 local_38;
  ushort uVar17;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  local_50 = local_50 & 0xff00;
  insn->necessaryPrefixLocation = startLoc - 1;
  local_40 = &insn->isPrefix26;
  bVar26 = true;
  local_48 = 0;
  local_38 = 0;
  do {
    if (insn->mode == MODE_64BIT) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,insn->readerCursor
                             );
      if (iVar9 != 0) {
        return -1;
      }
      uVar12 = insn->readerCursor;
      uVar19 = uVar12 + 1;
      insn->readerCursor = uVar19;
      if (((byte)local_50 & 0xf0) == 0x40) {
        prVar23 = (reader_info *)insn->readerArg;
        while( true ) {
          iVar9 = (*insn->reader)(prVar23,(uint8_t *)&local_50,uVar19);
          if (iVar9 != 0) {
            return -1;
          }
          if (((byte)local_50 & 0xf0) != 0x40) break;
          iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,
                                  insn->readerCursor);
          if (iVar9 != 0) {
            return -1;
          }
          prVar23 = (reader_info *)insn->readerArg;
          uVar19 = insn->readerCursor + 1;
          insn->readerCursor = uVar19;
        }
        if (((((byte)local_50 - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)((byte)local_50 - 0x2e) & 0x3f) & 1) != 0)) ||
            (((byte)local_50 - 0xf0 < 4 && ((byte)local_50 - 0xf0 != 1)))) ||
           ((byte)local_50 == 0x26)) goto LAB_002361cd;
        uVar12 = insn->readerCursor - 1;
      }
      insn->readerCursor = uVar12;
    }
LAB_002361cd:
    uVar19 = insn->readerCursor;
    iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,uVar19);
    if (iVar9 != 0) {
      return -1;
    }
    uVar3 = insn->readerCursor;
    uVar12 = uVar3 + 1;
    insn->readerCursor = uVar12;
    if ((uVar3 == insn->startLocation) && (((byte)local_50 & 0xfe) == 0xf2)) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_4c,uVar12);
      if (iVar9 != 0) {
        return -1;
      }
      if (((((byte)local_4c & 0xf8) == 0x90) || ((byte)local_4c == 0xf0)) ||
         (((byte)local_4c & 0xfe) == 0x86)) {
        insn->xAcquireRelease = true;
      }
      if ((((byte)local_50 == -0xd) && ((byte)local_4c - 0x88 < 0x40)) &&
         ((0xc000000000000003U >> ((ulong)((byte)local_4c - 0x88) & 0x3f) & 1) != 0)) {
        insn->xAcquireRelease = true;
      }
      if ((((byte)local_4c & 0xf0) == 0x40) && (insn->mode == MODE_64BIT)) {
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_4c,
                                insn->readerCursor);
        if (iVar9 != 0) {
          return -1;
        }
        uVar12 = insn->readerCursor + 1;
        insn->readerCursor = uVar12;
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_4c,uVar12);
        if (iVar9 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor - 1;
      }
    }
    bVar7 = (byte)local_50;
    if ((byte)local_50 < 0x3e) {
      if ((byte)local_50 == 0x26) {
        insn->segmentOverride = SEG_OVERRIDE_ES;
      }
      else if ((byte)local_50 == 0x2e) {
        insn->segmentOverride = SEG_OVERRIDE_CS;
      }
      else {
        if ((byte)local_50 != 0x36) goto LAB_0023638e;
        insn->segmentOverride = SEG_OVERRIDE_SS;
      }
      goto LAB_002363d0;
    }
    switch((byte)local_50) {
    case 100:
      insn->segmentOverride = SEG_OVERRIDE_FS;
      goto LAB_002363d0;
    case 0x65:
      insn->segmentOverride = SEG_OVERRIDE_GS;
LAB_002363d0:
      *(undefined2 *)(local_40 + 4) = 0;
      local_40[0] = false;
      local_40[1] = false;
      local_40[2] = false;
      local_40[3] = false;
      setPrefixPresent(insn,(byte)local_50,uVar19);
      insn->prefix1 = bVar7;
      break;
    case 0x66:
      setPrefixPresent(insn,(byte)local_50,uVar19);
      insn->prefix2 = bVar7;
      local_48 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      break;
    case 0x67:
      setPrefixPresent(insn,(byte)local_50,uVar19);
      insn->prefix3 = bVar7;
      local_38 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      break;
    default:
      if (((byte)local_50 - 0xf0 < 4) && ((byte)local_50 - 0xf0 != 1)) {
        insn->isPrefixf3 = false;
        insn->isPrefixf0 = false;
        insn->isPrefixf2 = false;
        setPrefixPresent(insn,(byte)local_50,uVar19);
        insn->prefix0 = bVar7;
      }
      else {
        if ((byte)local_50 == 0x3e) {
          insn->segmentOverride = SEG_OVERRIDE_DS;
          goto LAB_002363d0;
        }
LAB_0023638e:
        bVar26 = false;
      }
    }
  } while (bVar26);
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  if (bVar7 < 0xc4) {
    if (bVar7 == 0x62) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,insn->readerCursor);
      if (iVar9 == 0) {
        uVar12 = insn->readerCursor;
        uVar19 = uVar12 + 1;
        insn->readerCursor = uVar19;
        if ((local_4d & 0xc) != 0 || local_4d < 0xc0 && insn->mode != MODE_64BIT) {
          insn->readerCursor = uVar12 - 1;
          bVar26 = true;
          uVar14 = local_48;
          goto LAB_0023678d;
        }
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_49,uVar19);
        if (iVar9 == 0) {
          if ((local_49 & 4) == 0) {
            uVar19 = insn->readerCursor;
            insn->readerCursor = uVar19 - 2;
            insn->necessaryPrefixLocation = uVar19 - 4;
          }
          else {
            insn->vectorExtensionType = TYPE_EVEX;
          }
          bVar26 = true;
          uVar14 = local_48;
          if (insn->vectorExtensionType != TYPE_EVEX) goto LAB_0023678d;
          insn->vectorExtensionPrefix[0] = (byte)local_50;
          insn->vectorExtensionPrefix[1] = local_4d;
          iVar9 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,
                                  insn->readerCursor);
          if (iVar9 == 0) {
            prVar23 = (reader_info *)insn->readerArg;
            uVar19 = insn->readerCursor + 1;
            insn->readerCursor = uVar19;
            puVar22 = insn->vectorExtensionPrefix + 3;
            goto LAB_0023677d;
          }
        }
      }
LAB_0023678b:
      bVar26 = false;
      uVar14 = local_48;
      goto LAB_0023678d;
    }
    if (bVar7 == 0x8f) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,insn->readerCursor);
      if (iVar9 == 0) {
        if ((local_4d & 0x38) == 0) {
          insn->readerCursor = insn->readerCursor - 1;
        }
        else {
          insn->vectorExtensionType = TYPE_XOP;
        }
        uVar19 = insn->readerCursor;
        insn->necessaryPrefixLocation = uVar19 - 1;
        bVar26 = true;
        uVar14 = local_48;
        if (insn->vectorExtensionType == TYPE_XOP) goto LAB_00236739;
        goto LAB_0023678d;
      }
      goto LAB_0023678b;
    }
LAB_002364bd:
    if ((insn->mode == MODE_64BIT) && ((bVar7 & 0xf0) == 0x40)) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,insn->readerCursor);
      if (iVar9 != 0) {
        return -1;
      }
      while ((local_4d & 0xf0) == 0x40) {
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,
                                insn->readerCursor);
        if (iVar9 != 0) {
          return -1;
        }
        uVar19 = insn->readerCursor + 1;
        insn->readerCursor = uVar19;
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,uVar19);
        if (iVar9 != 0) {
          return -1;
        }
      }
      insn->rexPrefix = (byte)local_50;
      uVar19 = insn->readerCursor;
    }
    else {
      uVar19 = insn->readerCursor;
      insn->readerCursor = uVar19 - 1;
    }
    insn->necessaryPrefixLocation = uVar19 - 2;
  }
  else {
    if (bVar7 != 0xc4) {
      if (bVar7 != 0xc5) goto LAB_002364bd;
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,insn->readerCursor);
      if (iVar9 == 0) {
        if ((insn->mode == MODE_64BIT) || (0xbf < local_4d)) {
          insn->vectorExtensionType = TYPE_VEX_2B;
        }
        else {
          insn->readerCursor = insn->readerCursor - 1;
        }
        bVar26 = true;
        uVar14 = local_48;
        if (insn->vectorExtensionType != TYPE_VEX_2B) goto LAB_0023678d;
        insn->vectorExtensionPrefix[0] = (byte)local_50;
        puVar24 = insn->vectorExtensionPrefix + 1;
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,puVar24,insn->readerCursor);
        if (iVar9 == 0) {
          insn->readerCursor = insn->readerCursor + 1;
          if (insn->mode == MODE_64BIT) {
            bVar7 = (byte)~insn->vectorExtensionPrefix[1] >> 5 & 4;
            goto LAB_00236c4d;
          }
          goto LAB_00236c52;
        }
      }
      goto LAB_0023678b;
    }
    iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,insn->readerCursor);
    if (iVar9 != 0) goto LAB_0023678b;
    if ((insn->mode == MODE_64BIT) || (0xbf < local_4d)) {
      insn->vectorExtensionType = TYPE_VEX_3B;
    }
    else {
      insn->readerCursor = insn->readerCursor - 1;
    }
    uVar19 = insn->readerCursor;
    insn->necessaryPrefixLocation = uVar19 - 1;
    bVar26 = true;
    uVar14 = local_48;
    if (insn->vectorExtensionType == TYPE_VEX_3B) {
LAB_00236739:
      insn->vectorExtensionPrefix[0] = (byte)local_50;
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar19)
      ;
      if (iVar9 == 0) {
        prVar23 = (reader_info *)insn->readerArg;
        uVar19 = insn->readerCursor + 1;
        insn->readerCursor = uVar19;
        puVar22 = insn->vectorExtensionPrefix + 2;
LAB_0023677d:
        puVar24 = insn->vectorExtensionPrefix + 2;
        iVar9 = (*insn->reader)(prVar23,puVar22,uVar19);
        if (iVar9 == 0) {
          insn->readerCursor = insn->readerCursor + 1;
          if (insn->mode == MODE_64BIT) {
            bVar7 = (byte)~insn->vectorExtensionPrefix[1] >> 5 |
                    insn->vectorExtensionPrefix[2] >> 4 & 8;
LAB_00236c4d:
            insn->rexPrefix = bVar7 | 0x40;
          }
LAB_00236c52:
          bVar26 = true;
          uVar14 = 1;
          if ((*puVar24 & 3) != 1) {
            uVar14 = local_48 & 0xff;
          }
          goto LAB_0023678d;
        }
      }
      goto LAB_0023678b;
    }
LAB_0023678d:
    local_48 = uVar14;
    if (!bVar26) {
      return -1;
    }
  }
  DVar1 = insn->mode;
  bVar7 = (byte)local_48;
  bVar20 = (byte)local_38;
  if (DVar1 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar21 = (~bVar20 & 1) * '\x04' + '\x04';
      uVar6 = '\x04';
      uVar15 = '\x04';
      goto LAB_002367e8;
    }
    uVar15 = (~bVar7 & 1) * '\x02' + '\x02';
    insn->registerSize = uVar15;
    insn->addressSize = (~bVar20 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar15;
    insn->immediateSize = uVar15;
    if (insn->rexPrefix == 0) {
      uVar15 = (~bVar7 & 1) * '\x04' + '\x04';
    }
LAB_002367fb:
    insn->immSize = uVar15;
  }
  else {
    if (DVar1 == MODE_32BIT) {
      uVar15 = (~bVar7 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar15;
      bVar20 = ~bVar20;
LAB_002367db:
      uVar21 = (bVar20 & 1) * '\x02' + '\x02';
      uVar6 = uVar21;
LAB_002367e8:
      insn->addressSize = uVar21;
      insn->displacementSize = uVar6;
      insn->immediateSize = uVar15;
      goto LAB_002367fb;
    }
    if (DVar1 == MODE_16BIT) {
      uVar15 = (bVar7 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar15;
      goto LAB_002367db;
    }
  }
  insn->opcodeType = ONEBYTE;
  insn->firstByte = '\0';
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_00236831_caseD_1:
    insn->twoByteEscape = '\x0f';
switchD_002368ba_caseD_1:
    insn->opcodeType = TWOBYTE;
    break;
  case TYPE_VEX_3B:
    bVar7 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar7 != 3) {
      if (bVar7 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_002368ba_caseD_2;
      }
      if (bVar7 != 1) {
        return -1;
      }
      goto switchD_00236831_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_002368ba_caseD_3:
    insn->opcodeType = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    switch(insn->vectorExtensionPrefix[1] & 3) {
    case 0:
      return -1;
    case 1:
      goto switchD_002368ba_caseD_1;
    case 2:
switchD_002368ba_caseD_2:
      insn->opcodeType = THREEBYTE_38;
      break;
    case 3:
      goto switchD_002368ba_caseD_3;
    }
    break;
  case TYPE_XOP:
    bVar7 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar7 == 10) {
      insn->opcodeType = XOPA_MAP;
    }
    else if (bVar7 == 9) {
      insn->opcodeType = XOP9_MAP;
    }
    else {
      if (bVar7 != 8) {
        return -1;
      }
      insn->opcodeType = XOP8_MAP;
    }
    break;
  default:
    iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,insn->readerCursor);
    if (iVar9 != 0) {
      return -1;
    }
    uVar19 = insn->readerCursor + 1;
    insn->readerCursor = uVar19;
    insn->firstByte = (byte)local_50;
    if ((byte)local_50 == '\x0f') {
      insn->twoByteEscape = '\x0f';
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,uVar19);
      if (iVar9 != 0) {
        return -1;
      }
      uVar19 = insn->readerCursor + 1;
      insn->readerCursor = uVar19;
      if ((byte)local_50 < 0x38) {
        if ((byte)local_50 == 0xe) {
          insn->opcodeType = T3DNOW_MAP;
          insn->consumedModRM = true;
        }
        else {
          if ((byte)local_50 != 0xf) goto LAB_002371f7;
          iVar9 = readModRM(insn);
          if (iVar9 != 0) {
            return -1;
          }
          iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,
                                  insn->readerCursor);
          if (iVar9 != 0) {
            return -1;
          }
          insn->readerCursor = insn->readerCursor + 1;
          insn->opcodeType = T3DNOW_MAP;
        }
      }
      else if ((byte)local_50 == 0x3a) {
        insn->threeByteEscape = ':';
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,uVar19);
        if (iVar9 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_3A;
      }
      else if ((byte)local_50 == 0x38) {
        insn->threeByteEscape = '8';
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)&local_50,uVar19);
        if (iVar9 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_38;
      }
      else {
LAB_002371f7:
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = (byte)local_50;
    goto LAB_00236a81;
  }
  iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&insn->opcode,insn->readerCursor);
  if (iVar9 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
LAB_00236a81:
  DVar1 = insn->mode;
  VVar2 = insn->vectorExtensionType;
  bVar26 = DVar1 == MODE_64BIT;
  if (VVar2 == TYPE_NO_VEX_XOP) {
    if (((DVar1 == MODE_16BIT) || (insn->isPrefix66 != true)) ||
       (insn->prefix66 != insn->necessaryPrefixLocation)) {
      uVar19 = insn->necessaryPrefixLocation;
      if ((insn->isPrefix67 == true) && (insn->prefix67 == uVar19)) {
        uVar8 = bVar26 | 0x20;
      }
      else {
        uVar8 = (ushort)bVar26;
        if (DVar1 != MODE_16BIT) {
          if ((insn->isPrefixf3 == true) && (insn->prefixf3 == uVar19)) {
            uVar8 = bVar26 | 2;
          }
          else {
            if ((insn->isPrefixf2 != true) || (bVar5 = true, insn->prefixf2 != uVar19)) {
              bVar5 = false;
            }
            if (bVar5) {
              uVar8 = bVar26 | 4;
            }
          }
        }
      }
    }
    else {
      uVar8 = bVar26 | 0x10;
    }
  }
  else {
    uVar8 = 0x40;
    if (VVar2 == TYPE_EVEX) {
      uVar8 = 0x100;
    }
    uVar8 = bVar26 | uVar8;
    if (VVar2 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar8 = uVar8 | 0x10;
        break;
      case 2:
        uVar8 = uVar8 | 2;
        break;
      case 3:
        uVar8 = uVar8 | 4;
      }
      bVar7 = insn->vectorExtensionPrefix[3];
      if ((char)bVar7 < '\0') {
        uVar8 = uVar8 + 0x1000;
      }
      sVar18 = (bVar7 & 0x10) * 0x200;
      sVar4 = sVar18 + 0x800;
      if ((bVar7 & 7) == 0) {
        sVar4 = sVar18;
      }
      uVar8 = (bVar7 & 0x60) << 4 | sVar4 + uVar8;
    }
    else {
      if (VVar2 == TYPE_VEX_2B) {
        bVar7 = insn->vectorExtensionPrefix[1];
        uVar17 = (ushort)bVar7;
        uVar16 = (ushort)bVar7;
        switch(bVar7 & 3) {
        case 1:
          goto switchD_00236b50_caseD_1;
        case 2:
          goto switchD_00236b50_caseD_2;
        case 3:
          goto switchD_00236b50_caseD_3;
        }
      }
      else if (VVar2 == TYPE_XOP) {
        bVar7 = insn->vectorExtensionPrefix[2];
        uVar17 = (ushort)bVar7;
        uVar16 = (ushort)bVar7;
        switch(bVar7 & 3) {
        case 1:
          goto switchD_00236b50_caseD_1;
        case 2:
          goto switchD_00236b50_caseD_2;
        case 3:
          goto switchD_00236b50_caseD_3;
        }
      }
      else {
        if (VVar2 != TYPE_VEX_3B) {
          return -1;
        }
        bVar7 = insn->vectorExtensionPrefix[2];
        uVar17 = (ushort)bVar7;
        uVar16 = (ushort)bVar7;
        switch(bVar7 & 3) {
        case 1:
switchD_00236b50_caseD_1:
          uVar16 = uVar17;
          uVar8 = uVar8 | 0x10;
          break;
        case 2:
switchD_00236b50_caseD_2:
          uVar16 = uVar17;
          uVar8 = uVar8 | 2;
          break;
        case 3:
switchD_00236b50_caseD_3:
          uVar16 = uVar17;
          uVar8 = uVar8 | 4;
        }
      }
      uVar8 = uVar8 | (uVar16 & 4) << 5;
    }
  }
  uVar8 = uVar8 | insn->rexPrefix & 8;
  uVar17 = uVar8;
  if (((DVar1 == MODE_16BIT) && (insn->opcodeType == ONEBYTE)) &&
     (uVar17 = uVar8 ^ 0x20, insn->opcode != 0xe3)) {
    uVar17 = uVar8;
  }
  iVar9 = getIDWithAttrMask(&local_50,insn,uVar17);
  if (iVar9 != 0) {
    return -1;
  }
  if (insn->mode == MODE_64BIT) {
LAB_00236cf3:
    uVar8 = local_50;
    if ((insn->opcodeType == ONEBYTE) && ((insn->opcode & 0xfc) == 0xa0)) {
      uVar8 = uVar17 | 0x20;
      if (insn->isPrefix67 == false) {
        uVar8 = uVar17;
      }
      uVar17 = uVar8 | 0x10;
      if (insn->isPrefix66 == false) {
        uVar17 = uVar8;
      }
      uVar8 = uVar17 ^ 0x30;
      if (insn->mode != MODE_16BIT) {
        uVar8 = uVar17;
      }
      iVar9 = getIDWithAttrMask(&local_50,insn,uVar8);
      if (iVar9 != 0) {
        return -1;
      }
LAB_00236e57:
      uVar14 = (ulong)local_50;
      insn->instructionID = local_50;
      goto LAB_00236e6e;
    }
    if (insn->mode == MODE_16BIT) {
      if ((uVar17 & 0x10) == 0) {
LAB_00236d6e:
        uVar25 = (ulong)local_50;
        iVar9 = getIDWithAttrMask(&local_4c,insn,uVar17 | 0x10);
        if (((iVar9 == 0) && (x86_16_bit_eq_lookup[uVar25] != 0)) &&
           (uVar11 = x86_16_bit_eq_lookup[uVar25] - 1, uVar13 = (ulong)uVar11, uVar11 < 0x465)) {
          uVar14 = (ulong)local_4c;
          do {
            if (x86_16_bit_eq_tbl[uVar13].first != uVar8) break;
            if (x86_16_bit_eq_tbl[uVar13].second == local_4c) {
              if (insn->isPrefix66 != (insn->mode == MODE_16BIT)) {
                insn->instructionID = local_4c;
                goto LAB_00236e6e;
              }
              break;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != 0x465);
        }
        insn->instructionID = uVar8;
        uVar14 = uVar25;
        goto LAB_00236e6e;
      }
    }
    else if (((uVar17 & 0x10) == 0) && (insn->isPrefix66 != false)) goto LAB_00236d6e;
    if (((insn->opcodeType != ONEBYTE) || (insn->opcode != 0x90)) || ((insn->rexPrefix & 1) == 0))
    goto LAB_00236e57;
    insn->opcode = 0x91;
    iVar9 = getIDWithAttrMask(&local_4c,insn,uVar17);
    if (iVar9 == 0) {
      uVar8 = local_4c;
    }
    insn->opcode = 0x90;
    insn->instructionID = uVar8;
    insn->spec = x86DisassemblerInstrSpecifiers + uVar8;
  }
  else {
    VVar2 = insn->vectorExtensionType;
    if (VVar2 == TYPE_VEX_3B) {
      uVar15 = insn->vectorExtensionPrefix[2];
    }
    else if (VVar2 == TYPE_XOP) {
      uVar15 = insn->vectorExtensionPrefix[2];
    }
    else {
      if (VVar2 != TYPE_EVEX) goto LAB_00236cf3;
      uVar15 = insn->vectorExtensionPrefix[2];
    }
    if (-1 < (char)uVar15) goto LAB_00236cf3;
    iVar9 = getIDWithAttrMask(&local_4c,insn,uVar17 | 8);
    if (iVar9 != 0) goto LAB_00236e57;
    uVar14 = (ulong)local_4c;
    if (is_64bit_insn[uVar14] != false) goto LAB_00236cf3;
    insn->instructionID = local_4c;
LAB_00236e6e:
    insn->spec = x86DisassemblerInstrSpecifiers + uVar14;
  }
  uVar8 = insn->instructionID;
  if (uVar8 == 0) {
    return -1;
  }
  if (insn->isPrefixf0 != true) {
    if ((insn->isPrefixf2 == true) && (insn->twoByteEscape == '\x0f')) {
      insn->prefix0 = '\0';
    }
    goto LAB_00237194;
  }
  uVar11 = (uint)uVar8;
  if (uVar8 < 0x731) {
    uVar10 = (uint)uVar8;
    if (uVar10 < 0x139) {
      if (((uVar8 - 0x23 < 0x37) && ((0x700700381c0e07U >> ((ulong)(uVar8 - 0x23) & 0x3f) & 1) != 0)
          ) || ((uVar8 - 0xb1 < 0x1e && ((0x381c0e07U >> (uVar8 - 0xb1 & 0x1f) & 1) != 0))))
      goto LAB_00237194;
      uVar11 = uVar11 - 99;
      if (0xe < uVar11) {
        return -1;
      }
      uVar10 = 0x7007;
    }
    else {
      if (uVar10 < 0x244) {
        if (0x21 < uVar10 - 0x139) {
          return -1;
        }
        if ((0x333333333U >> ((ulong)(uVar10 - 0x139) & 0x3f) & 1) == 0) {
          return -1;
        }
        goto LAB_00237194;
      }
      if (((uVar8 - 0x244 < 9) && ((0x1abU >> (uVar8 - 0x244 & 0x1f) & 1) != 0)) ||
         ((uVar8 - 0x297 < 9 && ((0x149U >> (uVar8 - 0x297 & 0x1f) & 1) != 0)))) goto LAB_00237194;
      uVar11 = uVar10 - 0x396;
      if (8 < uVar11) {
        return -1;
      }
      uVar10 = 0x149;
    }
  }
  else if (uVar8 < 0xb12) {
    if (((uVar8 - 0x731 < 0x3e) &&
        ((0x3c0e550004000055U >> ((ulong)(uVar8 - 0x731) & 0x3f) & 1) != 0)) ||
       ((uVar8 - 0xa0d < 0x1e && ((0x381c0e07U >> (uVar8 - 0xa0d & 0x1f) & 1) != 0))))
    goto LAB_00237194;
    uVar11 = uVar11 - 0x775;
    if (0xb < uVar11) {
      return -1;
    }
    uVar10 = 0xe07;
  }
  else {
    if ((uVar8 - 0x2239 < 0x3f) &&
       ((0x70381c0e00291055U >> ((ulong)(uVar8 - 0x2239) & 0x3f) & 1) != 0)) goto LAB_00237194;
    uVar11 = uVar11 - 0xb12;
    if (0x1d < uVar11) {
      return -1;
    }
    uVar10 = 0x381c0e07;
  }
  if ((uVar10 >> (uVar11 & 0x1f) & 1) == 0) {
    return -1;
  }
LAB_00237194:
  iVar9 = readOperands(insn);
  if (iVar9 != 0) {
    return -1;
  }
  uVar14 = insn->readerCursor - insn->startLocation;
  insn->length = uVar14;
  if (uVar14 < 0x10) {
    if (insn->operandSize == '\0') {
      insn->operandSize = insn->registerSize;
    }
    insn->operands = x86OperandSets[insn->spec->operands];
    return 0;
  }
  return -1;
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}